

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O2

void * __thiscall
google::protobuf::internal::ArenaImpl::SerialArena::AllocateAligned(SerialArena *this,size_t n)

{
  LogMessage *pLVar1;
  char *pcVar2;
  char *pcVar3;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((n + 7 & 0xfffffffffffffff8) != n) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/arena_impl.h"
               ,0xb8);
    pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: (internal::AlignUpTo8(n)) == (n): ");
    LogFinisher::operator=(&local_21,pLVar1);
    LogMessage::~LogMessage(&local_60);
  }
  pcVar2 = this->ptr_;
  pcVar3 = this->limit_;
  if (pcVar3 < pcVar2) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/arena_impl.h"
               ,0xb9);
    pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: (limit_) >= (ptr_): ");
    LogFinisher::operator=(&local_21,pLVar1);
    LogMessage::~LogMessage(&local_60);
    pcVar2 = this->ptr_;
    pcVar3 = this->limit_;
  }
  if ((ulong)((long)pcVar3 - (long)pcVar2) < n) {
    pcVar2 = (char *)AllocateAlignedFallback(this,n);
  }
  else {
    this->ptr_ = pcVar2 + n;
  }
  return pcVar2;
}

Assistant:

void* AllocateAligned(size_t n) {
      GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
      GOOGLE_DCHECK_GE(limit_, ptr_);
      if (PROTOBUF_PREDICT_FALSE(!HasSpace(n))) {
        return AllocateAlignedFallback(n);
      }
      void* ret = ptr_;
      ptr_ += n;
#ifdef ADDRESS_SANITIZER
      ASAN_UNPOISON_MEMORY_REGION(ret, n);
#endif  // ADDRESS_SANITIZER
      return ret;
    }